

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::InputFile::Data::~Data(Data *this)

{
  long in_RDI;
  Data *in_stack_00000020;
  Header *in_stack_ffffffffffffffe0;
  
  if ((*(long *)(in_RDI + 0x68) != 0) && (*(long **)(in_RDI + 0x68) != (long *)0x0)) {
    (**(code **)(**(long **)(in_RDI + 0x68) + 8))();
  }
  if ((*(long *)(in_RDI + 0x70) != 0) &&
     (in_stack_ffffffffffffffe0 = *(Header **)(in_RDI + 0x70),
     in_stack_ffffffffffffffe0 != (Header *)0x0)) {
    (**(code **)(*(long *)&(in_stack_ffffffffffffffe0->_map)._M_t._M_impl + 8))();
  }
  if ((*(long *)(in_RDI + 0x78) != 0) && (*(long **)(in_RDI + 0x78) != (long *)0x0)) {
    (**(code **)(**(long **)(in_RDI + 0x78) + 8))();
  }
  if ((*(long *)(in_RDI + 200) != 0) && (*(long **)(in_RDI + 200) != (long *)0x0)) {
    (**(code **)(**(long **)(in_RDI + 200) + 8))();
  }
  deleteCachedBuffer(in_stack_00000020);
  if ((((*(byte *)(in_RDI + 0xe8) & 1) != 0) && (*(long *)(in_RDI + 0xf0) != 0)) &&
     (*(long **)(in_RDI + 0xf0) != (long *)0x0)) {
    (**(code **)(**(long **)(in_RDI + 0xf0) + 8))();
  }
  FrameBuffer::~FrameBuffer((FrameBuffer *)0x235304);
  Header::~Header(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

InputFile::Data::~Data ()
{
    if (tFile)
        delete tFile;
    if (sFile)
        delete sFile;
    if (dsFile)
        delete dsFile;
    if (compositor)
        delete compositor;

    deleteCachedBuffer();

    if (multiPartBackwardSupport && multiPartFile)
        delete multiPartFile;
}